

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.c
# Opt level: O1

size_t segment(converter_desc *converter,ucs4_t **inbuf,size_t *inbuf_left,ucs4_t **outbuf,
              size_t *outbuf_left)

{
  ucs4_t *puVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ucs4_t *word;
  ulong uVar6;
  size_t match_len;
  size_t local_40;
  ucs4_t **local_38;
  
  word = *inbuf;
  sVar3 = *inbuf_left;
  local_38 = inbuf;
  if (*word == 0) {
    uVar6 = 0;
    uVar4 = 0;
  }
  else {
    uVar5 = 0;
    uVar4 = 0;
    uVar6 = 0;
    do {
      if ((*inbuf_left == 0) || (*outbuf_left == 0)) break;
      if ((uVar5 != 0) && (uVar5 == uVar4)) {
        sVar2 = sp_seg(converter,local_38,inbuf_left,outbuf,outbuf_left,uVar4 - uVar6);
        if (sVar2 == 0xffffffffffffffff) {
          return 0xffffffffffffffff;
        }
        uVar6 = uVar5;
        if (sVar2 == 0) goto LAB_00103a87;
      }
      dictionary_group_match_longest(converter->current_dictionary_group,word,0,&local_40);
      if (local_40 == 0) {
        local_40 = 1;
      }
      if (uVar4 < local_40 + uVar5) {
        uVar4 = local_40 + uVar5;
      }
      uVar5 = uVar5 + 1;
      puVar1 = word + 1;
      word = word + 1;
    } while (*puVar1 != 0);
  }
  if ((*inbuf_left != 0) && (*outbuf_left != 0)) {
    sVar2 = sp_seg(converter,local_38,inbuf_left,outbuf,outbuf_left,uVar4 - uVar6);
    if (sVar2 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    if (sVar2 == 0) {
LAB_00103a87:
      sVar3 = sVar3 - *inbuf_left;
      if (sVar3 != 0) {
        return sVar3;
      }
      errnum = CONVERTER_ERROR_OUTBUF;
      return 0xffffffffffffffff;
    }
  }
  if (converter->conversion_mode == OPENCC_CONVERSION_SEGMENT_ONLY) {
    *outbuf = *outbuf + -1;
    *outbuf_left = *outbuf_left + 1;
  }
  return sVar3 - *inbuf_left;
}

Assistant:

static size_t segment(converter_desc * converter,
		ucs4_t ** inbuf, size_t * inbuf_left,
		ucs4_t ** outbuf, size_t * outbuf_left)
{
	/* 歧義分割最短路徑分詞 */
	size_t i, start, bound;
	const ucs4_t * inbuf_start = *inbuf;
	size_t inbuf_left_start = *inbuf_left;
	size_t sp_seg_length;
	
	bound = 0;
	
	for (i = start = 0; inbuf_start[i] && *inbuf_left > 0 && *outbuf_left > 0; i ++)
	{
		if (i != 0 && i == bound)
		{
			/* 對歧義部分進行最短路徑分詞 */
			sp_seg_length = sp_seg(converter, inbuf, inbuf_left, outbuf, outbuf_left, bound - start);
			if (sp_seg_length ==  (size_t) -1)
				return (size_t) -1;
			if (sp_seg_length == 0)
			{
				if (inbuf_left_start - *inbuf_left > 0)
					return inbuf_left_start - *inbuf_left;
				/* 空間不足 */
				errnum = CONVERTER_ERROR_OUTBUF;
				return (size_t) -1;
			}
			start = i;
		}
	
		size_t match_len;
		dictionary_group_match_longest(
				converter->current_dictionary_group,
				inbuf_start + i,
				0,
				&match_len
		);
		
		if (match_len == 0)
			match_len = 1;
		
		if (i + match_len > bound)
			bound = i + match_len;
	}
	
	if (*inbuf_left > 0 && *outbuf_left > 0)
	{
		sp_seg_length = sp_seg(converter, inbuf, inbuf_left, outbuf, outbuf_left, bound - start);
		if (sp_seg_length ==  (size_t) -1)
			return (size_t) -1;
		if (sp_seg_length == 0)
		{
			if (inbuf_left_start - *inbuf_left > 0)
				return inbuf_left_start - *inbuf_left;
			/* 空間不足 */
			errnum = CONVERTER_ERROR_OUTBUF;
			return (size_t) -1;
		}
	}

	if (converter->conversion_mode == OPENCC_CONVERSION_SEGMENT_ONLY)
	{
		(*outbuf) --;
		(*outbuf_left) ++;
	}

	return inbuf_left_start - *inbuf_left;
}